

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<unsigned_short> *
testing::internal::ActionResultHolder<unsigned_short>::PerformAction<unsigned_short(unsigned_short)>
          (Action<unsigned_short_(unsigned_short)> *action,type args)

{
  Result RVar1;
  ActionResultHolder<unsigned_short> *pAVar2;
  _Head_base<0UL,_unsigned_short,_false> local_1a;
  
  pAVar2 = (ActionResultHolder<unsigned_short> *)operator_new(0x10);
  local_1a._M_head_impl =
       (args->super__Tuple_impl<0UL,_unsigned_short>).super__Head_base<0UL,_unsigned_short,_false>.
       _M_head_impl;
  RVar1 = Action<unsigned_short_(unsigned_short)>::Perform(action,(ArgumentTuple *)&local_1a);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_001adef0;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action,
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(internal::move(args))));
  }